

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

int __thiscall
smf::MidiFile::extractMidiData
          (MidiFile *this,istream *input,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *array,uchar *runningCommand)

{
  pointer *ppuVar1;
  pointer puVar2;
  long lVar3;
  iterator iVar4;
  byte bVar5;
  uchar uVar6;
  uint uVar7;
  undefined8 in_RAX;
  long *plVar8;
  ostream *poVar9;
  long lVar10;
  byte bVar11;
  uchar a;
  char *pcVar12;
  uchar d;
  ulong uVar13;
  uchar byte;
  uchar byte2;
  uchar byte3;
  uchar byte4;
  undefined8 uStack_38;
  
  puVar2 = (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  uStack_38 = in_RAX;
  uVar7 = std::istream::get();
  if (uVar7 == 0xffffffff) {
    pcVar12 = "Error: unexpected end of file.";
    lVar10 = 0x1e;
LAB_0011ed6f:
    plVar8 = &std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,lVar10);
    lVar10 = std::cerr;
LAB_0011ed7a:
    std::ios::widen((char)*(undefined8 *)(lVar10 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
  }
  else {
    bVar11 = (byte)uVar7;
    uStack_38._0_4_ = CONCAT13(bVar11,(undefined3)uStack_38);
    if (-1 < (char)bVar11) {
      bVar5 = *runningCommand;
      if (bVar5 == 0) {
        pcVar12 = "Error: running command with no previous command";
        lVar10 = 0x2f;
        goto LAB_0011ed6f;
      }
      if (bVar5 < 0xf0) goto LAB_0011ed24;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: running status not permitted with meta and sysex",
                 0x37);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," event.",7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Byte is 0x",10);
      *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
           *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 8;
      plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cerr,uVar7 & 0x7f);
      lVar10 = *plVar8;
      lVar3 = *(long *)(lVar10 + -0x18);
      *(uint *)((long)plVar8 + lVar3 + 0x18) =
           *(uint *)((long)plVar8 + lVar3 + 0x18) & 0xffffffb5 | 2;
      goto LAB_0011ed7a;
    }
    *runningCommand = bVar11;
    bVar5 = bVar11;
LAB_0011ed24:
    iVar4._M_current =
         (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,runningCommand);
    }
    else {
      *iVar4._M_current = bVar5;
      ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    if (-1 < (char)bVar11) {
      iVar4._M_current =
           (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,
                   (uchar *)((long)&uStack_38 + 3));
      }
      else {
        *iVar4._M_current = uStack_38._3_1_;
        ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    bVar5 = *runningCommand;
    uVar7 = bVar5 - 0x80 >> 4;
    if (7 < uVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error reading midifile",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Command byte was ",0x11);
      plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)*runningCommand);
      lVar10 = *plVar8;
      goto LAB_0011ed7a;
    }
    if ((0x4fU >> (uVar7 & 0x1f) & 1) == 0) {
      if ((0x30U >> (uVar7 & 0x1f) & 1) == 0) {
        if ((bVar5 == 0xf0) || (bVar5 == 0xf7)) {
          uVar13 = readVLValue(this,input);
          if (0 < (int)uVar13) {
            do {
              uVar6 = readByte(this,input);
              uStack_38._0_4_ = CONCAT13(uVar6,(undefined3)uStack_38);
              bVar5 = this->m_rwstatus;
              if ((bool)bVar5 != true) goto LAB_0011eda1;
              iVar4._M_current =
                   (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,
                           (uchar *)((long)&uStack_38 + 3));
              }
              else {
                *iVar4._M_current = uVar6;
                ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              uVar7 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar7;
            } while (uVar7 != 0);
          }
        }
        else if (bVar5 == 0xff) {
          if ((char)bVar11 < '\0') {
            uVar6 = readByte(this,input);
            uStack_38._0_4_ = CONCAT13(uVar6,(undefined3)uStack_38);
            bVar5 = this->m_rwstatus;
            if ((bool)bVar5 != true) goto LAB_0011eda1;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      (array,(value_type_conflict2 *)((long)&uStack_38 + 3));
          }
          uStack_38._0_5_ = (uint5)(uint)uStack_38;
          uStack_38._0_7_ = (uint7)uStack_38 & 0xffffffffffff;
          uStack_38 = (ulong)(uint7)uStack_38;
          uVar6 = readByte(this,input);
          uStack_38._0_6_ = CONCAT15(uVar6,(uint5)uStack_38);
          bVar5 = this->m_rwstatus;
          if ((bool)bVar5 != true) goto LAB_0011eda1;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (array,(value_type_conflict2 *)((long)&uStack_38 + 5));
          uVar13 = (ulong)(char)uStack_38._5_1_;
          if ((long)uVar13 < 0) {
            uVar6 = readByte(this,input);
            uStack_38._0_5_ = CONCAT14(uVar6,(uint)uStack_38);
            bVar5 = this->m_rwstatus;
            if ((bool)bVar5 != true) goto LAB_0011eda1;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                      (array,(value_type_conflict2 *)((long)&uStack_38 + 4));
            if (uStack_38._4_1_ < 0x81) {
              uVar6 = '\0';
LAB_0011f147:
              a = uStack_38._5_1_;
              bVar11 = uStack_38._4_1_;
              d = '\0';
            }
            else {
              uVar6 = readByte(this,input);
              uStack_38._0_7_ = CONCAT16(uVar6,(undefined6)uStack_38);
              bVar5 = this->m_rwstatus;
              if ((bool)bVar5 != true) goto LAB_0011eda1;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        (array,(value_type_conflict2 *)((long)&uStack_38 + 6));
              if (-1 < (char)uStack_38._6_1_) {
                uVar6 = uStack_38._6_1_;
                goto LAB_0011f147;
              }
              uVar6 = readByte(this,input);
              uStack_38 = CONCAT17(uVar6,(uint7)uStack_38);
              bVar5 = this->m_rwstatus;
              if ((bool)bVar5 != true) goto LAB_0011eda1;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        (array,(value_type_conflict2 *)((long)&uStack_38 + 7));
              if ((long)uStack_38 < 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Error: cannot handle large VLVs",0x1f);
                poVar9 = (ostream *)&std::cerr;
                goto LAB_0011f0aa;
              }
              a = uStack_38._5_1_;
              bVar11 = uStack_38._4_1_;
              uVar6 = uStack_38._6_1_;
              d = uStack_38._7_1_;
            }
            bVar5 = 0;
            uVar13 = unpackVLV(this,a,bVar11,uVar6,d,'\0');
            if (this->m_rwstatus == false) goto LAB_0011eda1;
          }
          if (0 < (int)uVar13) {
            do {
              uVar6 = readByte(this,input);
              uStack_38._0_4_ = CONCAT13(uVar6,(undefined3)uStack_38);
              bVar5 = this->m_rwstatus;
              if ((bool)bVar5 != true) goto LAB_0011eda1;
              iVar4._M_current =
                   (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,
                           (uchar *)((long)&uStack_38 + 3));
              }
              else {
                *iVar4._M_current = uVar6;
                ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppuVar1 = *ppuVar1 + 1;
              }
              uVar7 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar7;
            } while (uVar7 != 0);
          }
        }
LAB_0011f077:
        bVar5 = 1;
        goto LAB_0011eda1;
      }
LAB_0011efe4:
      bVar5 = 1;
      if (-1 < (char)bVar11) goto LAB_0011eda1;
      uVar6 = readByte(this,input);
      uStack_38._0_4_ = CONCAT13(uVar6,(undefined3)uStack_38);
      bVar5 = this->m_rwstatus;
      if ((bool)bVar5 != true) goto LAB_0011eda1;
      if (-1 < (char)uVar6) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (array,(value_type_conflict2 *)((long)&uStack_38 + 3));
        goto LAB_0011f077;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"MIDI data byte too large: ",0x1a);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(uint)uStack_38._3_1_);
LAB_0011f0aa:
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      uVar6 = readByte(this,input);
      uStack_38._0_4_ = CONCAT13(uVar6,(undefined3)uStack_38);
      bVar5 = this->m_rwstatus;
      if ((bool)bVar5 != true) goto LAB_0011eda1;
      if (-1 < (char)uVar6) {
        iVar4._M_current =
             (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)array,iVar4,
                     (uchar *)((long)&uStack_38 + 3));
        }
        else {
          *iVar4._M_current = uVar6;
          ppuVar1 = &(array->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        goto LAB_0011efe4;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"MIDI data byte too large: ",0x1a);
      plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cerr,(uint)uStack_38._3_1_);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
    }
    this->m_rwstatus = false;
  }
  bVar5 = 0;
LAB_0011eda1:
  return (int)bVar5;
}

Assistant:

int MidiFile::extractMidiData(std::istream& input, std::vector<uchar>& array,
	uchar& runningCommand) {

	int character;
	uchar byte;
	array.clear();
	int runningQ;

	character = input.get();
	if (character == EOF) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	} else {
		byte = (uchar)character;
	}

	if (byte < 0x80) {
		runningQ = 1;
		if (runningCommand == 0) {
			std::cerr << "Error: running command with no previous command" << std::endl;
			return 0;
		}
		if (runningCommand >= 0xf0) {
			std::cerr << "Error: running status not permitted with meta and sysex"
			     << " event." << std::endl;
			std::cerr << "Byte is 0x" << std::hex << (int)byte << std::dec << std::endl;
			return 0;
		}
	} else {
		runningCommand = byte;
		runningQ = 0;
	}

	array.push_back(runningCommand);
	if (runningQ) {
		array.push_back(byte);
	}

	switch (runningCommand & 0xf0) {
		case 0x80:        // note off (2 more bytes)
		case 0x90:        // note on (2 more bytes)
		case 0xA0:        // aftertouch (2 more bytes)
		case 0xB0:        // cont. controller (2 more bytes)
		case 0xE0:        // pitch wheel (2 more bytes)
			byte = readByte(input);
			if (!status()) { return m_rwstatus; }
			if (byte > 0x7f) {
				std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
				m_rwstatus = false; return m_rwstatus;
			}
			array.push_back(byte);
			if (!runningQ) {
				byte = readByte(input);
				if (!status()) { return m_rwstatus; }
				if (byte > 0x7f) {
					std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
					m_rwstatus = false; return m_rwstatus;
				}
				array.push_back(byte);
			}
			break;
		case 0xC0:        // patch change (1 more byte)
		case 0xD0:        // channel pressure (1 more byte)
			if (!runningQ) {
				byte = readByte(input);
				if (!status()) { return m_rwstatus; }
				if (byte > 0x7f) {
					std::cerr << "MIDI data byte too large: " << (int)byte << std::endl;
					m_rwstatus = false; return m_rwstatus;
				}
				array.push_back(byte);
			}
			break;
		case 0xF0:
			switch (runningCommand) {
				case 0xff:                 // meta event
					{
					if (!runningQ) {
						byte = readByte(input); // meta type
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					ulong length = 0;
					uchar byte1 = 0;
					uchar byte2 = 0;
					uchar byte3 = 0;
					uchar byte4 = 0;
					byte1 = readByte(input);
					if (!status()) { return m_rwstatus; }
					array.push_back(byte1);
					if (byte1 >= 0x80) {
						byte2 = readByte(input);
						if (!status()) { return m_rwstatus; }
						array.push_back(byte2);
						if (byte2 > 0x80) {
							byte3 = readByte(input);
							if (!status()) { return m_rwstatus; }
							array.push_back(byte3);
							if (byte3 >= 0x80) {
								byte4 = readByte(input);
								if (!status()) { return m_rwstatus; }
								array.push_back(byte4);
								if (byte4 >= 0x80) {
									std::cerr << "Error: cannot handle large VLVs" << std::endl;
									m_rwstatus = false; return m_rwstatus;
								} else {
									length = unpackVLV(byte1, byte2, byte3, byte4);
									if (!m_rwstatus) { return m_rwstatus; }
								}
							} else {
								length = unpackVLV(byte1, byte2, byte3);
								if (!m_rwstatus) { return m_rwstatus; }
							}
						} else {
							length = unpackVLV(byte1, byte2);
							if (!m_rwstatus) { return m_rwstatus; }
						}
					} else {
						length = byte1;
					}
					for (int j=0; j<(int)length; j++) {
						byte = readByte(input); // meta type
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					}
					break;

				// The 0xf0 and 0xf7 meta commands deal with system-exclusive
				// messages. 0xf0 is used to either start a message or to store
				// a complete message.  The 0xf0 is part of the outgoing MIDI
				// bytes.  The 0xf7 message is used to send arbitrary bytes,
				// typically the middle or ends of system exclusive messages.  The
				// 0xf7 byte at the start of the message is not part of the
				// outgoing raw MIDI bytes, but is kept in the MidiFile message
				// to indicate a raw MIDI byte message (typically a partial
				// system exclusive message).
				case 0xf7:   // Raw bytes. 0xf7 is not part of the raw
				             // bytes, but are included to indicate
				             // that this is a raw byte message.
				case 0xf0:   // System Exclusive message
					{         // (complete, or start of message).
					int length = (int)readVLValue(input);
					for (int i=0; i<length; i++) {
						byte = readByte(input);
						if (!status()) { return m_rwstatus; }
						array.push_back(byte);
					}
					}
					break;

				// other "F" MIDI commands are not expected, but can be
				// handled here if they exist.
			}
			break;
		default:
			std::cout << "Error reading midifile" << std::endl;
			std::cout << "Command byte was " << (int)runningCommand << std::endl;
			return 0;
	}
	return 1;
}